

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

bool is_carrying(CHAR_DATA *ch,int vnum)

{
  OBJ_DATA *cont;
  OBJ_DATA *obj;
  int vnum_local;
  CHAR_DATA *ch_local;
  
  obj = ch->carrying;
  while( true ) {
    if (obj == (OBJ_DATA *)0x0) {
      return false;
    }
    if (obj->pIndexData->vnum == vnum) break;
    for (cont = obj->contains; cont != (OBJ_DATA *)0x0; cont = cont->next_content) {
      if (cont->pIndexData->vnum == vnum) {
        return true;
      }
    }
    obj = obj->next_content;
  }
  return true;
}

Assistant:

bool is_carrying(CHAR_DATA *ch, int vnum)
{
	OBJ_DATA *obj, *cont;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == vnum)
			return true;

		for (cont = obj->contains; cont; cont = cont->next_content)
		{
			if (cont->pIndexData->vnum == vnum)
				return true;
		}
	}

	return false;
}